

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_glyphpath_curveTo
               (CF2_GlyphPath glyphpath,CF2_F16Dot16 x1,CF2_F16Dot16 y1,CF2_F16Dot16 x2,
               CF2_F16Dot16 y2,CF2_F16Dot16 x3,CF2_F16Dot16 y3)

{
  FT_Fast *pFVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  FT_Vector start;
  FT_Vector nextP1;
  int local_6c;
  undefined1 auStack_68 [4];
  CF2_F16Dot16 xOffset3;
  FT_Vector P0;
  int local_50;
  CF2_F16Dot16 xOffset1;
  CF2_F16Dot16 yOffset1;
  CF2_F16Dot16 yOffset3;
  CF2_F16Dot16 local_3c;
  long local_38;
  
  local_38 = CONCAT44(local_38._4_4_,y1);
  local_3c = x3;
  cf2_glyphpath_computeOffset
            (glyphpath,(CF2_F16Dot16)(glyphpath->currentCS).x,(CF2_F16Dot16)(glyphpath->currentCS).y
             ,x1,y1,(CF2_F16Dot16 *)((long)&P0.y + 4),&local_50);
  cf2_glyphpath_computeOffset(glyphpath,x2,y2,x3,y3,&local_6c,&xOffset1);
  pFVar1 = &glyphpath->callbacks->windingMomentum;
  *pFVar1 = *pFVar1 + ((y2 - (int)local_38 >> 0x10) * (x1 >> 0x10) -
                      (x2 - x1 >> 0x10) * ((int)local_38 >> 0x10));
  start.x = (long)((int)(glyphpath->currentCS).x + P0.y._4_4_);
  start.y = (long)((int)(glyphpath->currentCS).y + local_50);
  iVar4 = local_6c + local_3c;
  lVar2 = (long)(P0.y._4_4_ + x1);
  lVar6 = (long)(local_50 + (int)local_38);
  _auStack_68 = start.x;
  P0.x = start.y;
  if (glyphpath->moveIsPending != '\0') {
    _yOffset1 = (long)(local_50 + (int)local_38);
    local_38 = (long)(P0.y._4_4_ + x1);
    cf2_glyphpath_pushMove(glyphpath,start);
    glyphpath->moveIsPending = '\0';
    glyphpath->pathIsOpen = '\x01';
    (glyphpath->offsetStart1).x = local_38;
    (glyphpath->offsetStart1).y = _yOffset1;
    lVar2 = local_38;
    lVar6 = _yOffset1;
  }
  lVar3 = (long)(y2 + xOffset1);
  lVar5 = (long)(xOffset1 + y3);
  if (glyphpath->elemIsQueued != '\0') {
    nextP1.y = lVar6;
    nextP1.x = lVar2;
    _yOffset1 = (long)(xOffset1 + y3);
    local_38 = (long)(y2 + xOffset1);
    cf2_glyphpath_pushPrevElem(glyphpath,&glyphpath->hintMap,(FT_Vector *)auStack_68,nextP1,'\0');
    lVar3 = local_38;
    lVar5 = _yOffset1;
  }
  glyphpath->elemIsQueued = '\x01';
  glyphpath->prevElemOp = 4;
  (glyphpath->prevElemP0).x = _auStack_68;
  (glyphpath->prevElemP0).y = P0.x;
  (glyphpath->prevElemP1).x = lVar2;
  (glyphpath->prevElemP1).y = lVar6;
  (glyphpath->prevElemP2).x = (long)(x2 + local_6c);
  (glyphpath->prevElemP2).y = lVar3;
  (glyphpath->prevElemP3).x = (long)iVar4;
  (glyphpath->prevElemP3).y = lVar5;
  if (glyphpath->hintMask->isNew != '\0') {
    cf2_hintmap_build(&glyphpath->hintMap,glyphpath->hStemHintArray,glyphpath->vStemHintArray,
                      glyphpath->hintMask,glyphpath->hintOriginY,'\0');
  }
  (glyphpath->currentCS).x = (long)local_3c;
  (glyphpath->currentCS).y = (long)y3;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_glyphpath_curveTo( CF2_GlyphPath  glyphpath,
                         CF2_Fixed      x1,
                         CF2_Fixed      y1,
                         CF2_Fixed      x2,
                         CF2_Fixed      y2,
                         CF2_Fixed      x3,
                         CF2_Fixed      y3 )
  {
    CF2_Fixed  xOffset1, yOffset1, xOffset3, yOffset3;
    FT_Vector  P0, P1, P2, P3;


    /* TODO: ignore zero length portions of curve?? */
    cf2_glyphpath_computeOffset( glyphpath,
                                 glyphpath->currentCS.x,
                                 glyphpath->currentCS.y,
                                 x1,
                                 y1,
                                 &xOffset1,
                                 &yOffset1 );
    cf2_glyphpath_computeOffset( glyphpath,
                                 x2,
                                 y2,
                                 x3,
                                 y3,
                                 &xOffset3,
                                 &yOffset3 );

    /* add momentum from the middle segment */
    glyphpath->callbacks->windingMomentum =
      ADD_INT32( glyphpath->callbacks->windingMomentum,
                 cf2_getWindingMomentum( x1, y1, x2, y2 ) );

    /* construct offset points */
    P0.x = ADD_INT32( glyphpath->currentCS.x, xOffset1 );
    P0.y = ADD_INT32( glyphpath->currentCS.y, yOffset1 );
    P1.x = ADD_INT32( x1, xOffset1 );
    P1.y = ADD_INT32( y1, yOffset1 );
    /* note: preserve angle of final segment by using offset3 at both ends */
    P2.x = ADD_INT32( x2, xOffset3 );
    P2.y = ADD_INT32( y2, yOffset3 );
    P3.x = ADD_INT32( x3, xOffset3 );
    P3.y = ADD_INT32( y3, yOffset3 );

    if ( glyphpath->moveIsPending )
    {
      /* emit offset 1st point as MoveTo */
      cf2_glyphpath_pushMove( glyphpath, P0 );

      glyphpath->moveIsPending = FALSE;
      glyphpath->pathIsOpen    = TRUE;

      glyphpath->offsetStart1 = P1;              /* record second point */
    }

    if ( glyphpath->elemIsQueued )
    {
      FT_ASSERT( cf2_hintmap_isValid( &glyphpath->hintMap ) ||
                 glyphpath->hintMap.count == 0              );

      cf2_glyphpath_pushPrevElem( glyphpath,
                                  &glyphpath->hintMap,
                                  &P0,
                                  P1,
                                  FALSE );
    }

    /* queue the current element with offset points */
    glyphpath->elemIsQueued = TRUE;
    glyphpath->prevElemOp   = CF2_PathOpCubeTo;
    glyphpath->prevElemP0   = P0;
    glyphpath->prevElemP1   = P1;
    glyphpath->prevElemP2   = P2;
    glyphpath->prevElemP3   = P3;

    /* update current map */
    if ( cf2_hintmask_isNew( glyphpath->hintMask ) )
      cf2_hintmap_build( &glyphpath->hintMap,
                         glyphpath->hStemHintArray,
                         glyphpath->vStemHintArray,
                         glyphpath->hintMask,
                         glyphpath->hintOriginY,
                         FALSE );

    glyphpath->currentCS.x = x3;       /* pre-offset current point */
    glyphpath->currentCS.y = y3;
  }